

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnV128ConstExpr(BinaryReaderIR *this,v128 value_bits)

{
  Result RVar1;
  pointer *__ptr;
  Location *in_R8;
  v128 val;
  undefined1 local_a8 [128];
  
  val.v._0_8_ = value_bits.v._8_8_;
  GetLocation((Location *)(local_a8 + 0x10),this);
  val.v._8_8_ = (Location *)(local_a8 + 0x10);
  Const::V128((Const *)(local_a8 + 0x30),value_bits.v._0_8_,val,in_R8);
  std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_a8);
  local_a8._8_8_ = local_a8._0_8_;
  local_a8._0_8_ = (long *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)(local_a8 + 8)
                    );
  if ((long *)local_a8._8_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._8_8_ + 8))();
  }
  if ((long *)local_a8._0_8_ != (long *)0x0) {
    (**(code **)(*(long *)local_a8._0_8_ + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnV128ConstExpr(v128 value_bits) {
  return AppendExpr(
      std::make_unique<ConstExpr>(Const::V128(value_bits, GetLocation())));
}